

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  ParseError PVar3;
  ostream *poVar4;
  char *local_1f8;
  undefined1 local_198 [32];
  undefined1 local_178 [8];
  CCompiler compiler;
  StdIoInterpreter semantics;
  string local_118 [8];
  string mode;
  int local_f8;
  int local_f4;
  int column;
  int line;
  string errorName;
  undefined1 local_c8 [4];
  ParseError error;
  Brainfuck brainfuck;
  allocator local_59;
  string local_58 [32];
  string local_38 [8];
  string code;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"usage: BrainfuckInterpreter file.bf [i/c]");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    return -1;
  }
  std::__cxx11::string::string(local_38);
  pcVar1 = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,pcVar1,&local_59);
  bVar2 = readFile((string *)local_58,(string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"failed to read input file!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
    brainfuck._line = 1;
    goto LAB_0010b9a8;
  }
  Brainfuck::Brainfuck((Brainfuck *)local_c8);
  PVar3 = Brainfuck::Parse((Brainfuck *)local_c8,(string *)local_38);
  if (PVar3 == Success) {
    if (argc < 3) {
      local_1f8 = "i";
    }
    else {
      local_1f8 = argv[2];
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,local_1f8,(allocator *)((long)&semantics._ptr + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&semantics._ptr + 7));
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_118,"i");
    if (bVar2) {
      StdIoInterpreter::StdIoInterpreter((StdIoInterpreter *)&compiler._indent,30000);
      Brainfuck::Execute((Brainfuck *)local_c8,(Interpreter *)&compiler._indent);
      StdIoInterpreter::~StdIoInterpreter((StdIoInterpreter *)&compiler._indent);
LAB_0010b962:
      argv_local._4_4_ = 0;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_118,"c");
      if (bVar2) {
        CCompiler::CCompiler((CCompiler *)local_178);
        Brainfuck::Compile((Brainfuck *)local_c8,(Compiler *)local_178);
        CCompiler::GetCode_abi_cxx11_((CCompiler *)local_198);
        std::operator<<((ostream *)&std::cout,(string *)local_198);
        std::__cxx11::string::~string((string *)local_198);
        CCompiler::~CCompiler((CCompiler *)local_178);
        goto LAB_0010b962;
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"Unknown mode!");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = -1;
    }
    brainfuck._line = 1;
    std::__cxx11::string::~string(local_118);
  }
  else {
    std::__cxx11::string::string((string *)&column);
    if (PVar3 == ErrorBracketMismatch) {
      std::__cxx11::string::operator=((string *)&column,"ErrorBracketMismatch");
    }
    else if (PVar3 == GenericError) {
      std::__cxx11::string::operator=((string *)&column,"GenericError");
    }
    else {
      std::__cxx11::string::operator=((string *)&column,"UNKNOWN");
    }
    Brainfuck::GetLocation((Brainfuck *)local_c8,&local_f4,&local_f8);
    poVar4 = std::operator<<((ostream *)&std::cout,"There was an error parsing (");
    poVar4 = std::operator<<(poVar4,(string *)&column);
    poVar4 = std::operator<<(poVar4,") on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_f4);
    poVar4 = std::operator<<(poVar4," column ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_f8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
    brainfuck._line = 1;
    std::__cxx11::string::~string((string *)&column);
  }
  Brainfuck::~Brainfuck((Brainfuck *)local_c8);
LAB_0010b9a8:
  std::__cxx11::string::~string(local_38);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
    if(argc < 2)
    {
        std::cout << "usage: BrainfuckInterpreter file.bf [i/c]" << std::endl;
        return -1;
    }

    std::string code;
    if(!readFile(argv[1], code))
    {
        std::cout << "failed to read input file!" << std::endl;
        return -1;
    }

    auto brainfuck = Brainfuck();
    auto error = brainfuck.Parse(code);
    if (error != Brainfuck::Success)
    {
        std::string errorName;
        switch (error)
        {
            case Brainfuck::ErrorBracketMismatch:
                errorName = "ErrorBracketMismatch";
                break;

            case Brainfuck::GenericError:
                errorName = "GenericError";
                break;

            default:
                errorName = "UNKNOWN";
                break;
        }
        int line, column;
        brainfuck.GetLocation(line, column);
        std::cout << "There was an error parsing (" << errorName << ") on line " << line << " column " << column << std::endl;
        return -1;
    }

    auto mode = std::string(argc > 2 ? argv[2] : "i");
    if(mode == "i") //interpret the file
    {
        auto semantics = StdIoInterpreter();
        brainfuck.Execute(semantics);
    }
    else if(mode == "c") //compile to c
    {
        auto compiler = CCompiler();
        brainfuck.Compile(compiler);
        std::cout << compiler.GetCode();
    }
    else
    {
        std::cout << "Unknown mode!" << std::endl;
        return -1;
    }
    return 0;
}